

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_xmlwriter.hpp
# Opt level: O3

XmlWriter * __thiscall Catch::XmlWriter::writeText(XmlWriter *this,string *text,bool indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *os;
  pointer pcVar2;
  XmlEncode local_50;
  
  if (text->_M_string_length != 0) {
    if (this->m_tagIsOpen == true) {
      std::__ostream_insert<char,std::char_traits<char>>(this->m_os,">\n",2);
      this->m_tagIsOpen = false;
      if (indent) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (this->m_os,(this->m_indent)._M_dataplus._M_p,(this->m_indent)._M_string_length);
      }
    }
    os = this->m_os;
    paVar1 = &local_50.m_str.field_2;
    pcVar2 = (text->_M_dataplus)._M_p;
    local_50.m_str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + text->_M_string_length);
    local_50.m_forWhat = ForTextNodes;
    XmlEncode::encodeTo(&local_50,os);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.m_str._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.m_str._M_dataplus._M_p,
                      local_50.m_str.field_2._M_allocated_capacity + 1);
    }
    this->m_needsNewline = true;
  }
  return this;
}

Assistant:

XmlWriter& writeText( std::string const& text, bool indent = true ) {
            if( !text.empty() ){
                bool tagWasOpen = m_tagIsOpen;
                ensureTagClosed();
                if( tagWasOpen && indent )
                    stream() << m_indent;
                stream() << XmlEncode( text );
                m_needsNewline = true;
            }
            return *this;
        }